

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiAreaPrivate::showRubberBandFor(QMdiAreaPrivate *this,QMdiSubWindow *subWindow)

{
  QRubberBand *this_00;
  QMdiAreaTabBar *this_01;
  qsizetype qVar1;
  QRect *geom;
  long in_FS_OFFSET;
  QRect local_38;
  QMdiSubWindow *local_28;
  long local_20;
  
  geom = &local_38;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = subWindow;
  if ((subWindow != (QMdiSubWindow *)0x0) &&
     (this_00 = this->rubberBand, this_00 != (QRubberBand *)0x0)) {
    if (this->viewMode == TabbedView) {
      this_01 = this->tabBar;
      qVar1 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                        (&this->childWindows,&local_28,0);
      local_38 = QTabBar::tabRect(&this_01->super_QTabBar,(int)qVar1);
    }
    else {
      geom = &((subWindow->super_QWidget).data)->crect;
    }
    QRubberBand::setGeometry(this_00,geom);
    QWidget::raise(&this->rubberBand->super_QWidget,(int)geom);
    QWidget::show(&this->rubberBand->super_QWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::showRubberBandFor(QMdiSubWindow *subWindow)
{
    if (!subWindow || !rubberBand)
        return;

#if QT_CONFIG(tabbar)
    if (viewMode == QMdiArea::TabbedView)
        rubberBand->setGeometry(tabBar->tabRect(childWindows.indexOf(subWindow)));
    else
#endif
        rubberBand->setGeometry(subWindow->geometry());

    rubberBand->raise();
    rubberBand->show();
}